

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void * prf_array_remove(void *id,int index)

{
  uint uVar1;
  void **ptr;
  
  uVar1 = *(uint *)((long)id + -4) >> 4;
  if (index < (int)(uVar1 - 1)) {
    memmove((void *)((long)id + (long)index * 8),(void *)((long)id + (long)index * 8 + 8),
            (long)(int)(uVar1 + ~index) << 3);
  }
  *(int *)((long)id + -4) = *(int *)((long)id + -4) + -0x10;
  return id;
}

Assistant:

void *
prf_array_remove(void *id, int index)
{
  array * arr;
  assert( id != NULL && index >= 0 );
  arr = id_to_array(id);
  assert( index < arr->numelem && arr->numelem >= 0 );
  if ( (arr->numelem - 1) > index ) {
    void ** ptr = (void **) id;
    assert( ((arr->numelem - index - 1) * sizeof(void *)) > 0 );
    memmove( ((char *) ptr) + (index * sizeof(void *)),
             ((char *) ptr) + ((index + 1) * sizeof(void *)),
             (arr->numelem - index - 1) * sizeof(void *));
  }
#ifndef NDEBUG
  else {
    assert( index == arr->numelem );
  }
#endif /* ! NDEBUG */
  arr->numelem--;
  return id;
}